

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int json_emit_quoted_str(char *s,int s_len,char *str,int len)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  
  if (0 < s_len) {
    *s = '\"';
  }
  pcVar4 = s + s_len;
  pcVar3 = str + len;
  pcVar2 = s + 1;
  do {
    if (pcVar3 <= str) {
      if (pcVar2 < pcVar4) {
        *pcVar2 = '\"';
      }
      pcVar2 = pcVar2 + 1;
      if (pcVar2 < pcVar4) {
        *pcVar2 = '\0';
      }
      return (int)pcVar2 - (int)s;
    }
    cVar1 = *str;
    switch(cVar1) {
    case '\b':
      if (pcVar2 < pcVar4) {
        *pcVar2 = '\\';
      }
      lVar5 = 2;
      if (pcVar2 + 1 < pcVar4) {
        pcVar2[1] = 'b';
LAB_001061be:
        lVar5 = 2;
      }
      break;
    case '\t':
      if (pcVar2 < pcVar4) {
        *pcVar2 = '\\';
      }
      lVar5 = 2;
      if (pcVar2 + 1 < pcVar4) {
        pcVar2[1] = 't';
        goto LAB_001061be;
      }
      break;
    case '\n':
      if (pcVar2 < pcVar4) {
        *pcVar2 = '\\';
      }
      lVar5 = 2;
      if (pcVar2 + 1 < pcVar4) {
        pcVar2[1] = 'n';
        goto LAB_001061be;
      }
      break;
    case '\v':
switchD_001060dd_caseD_b:
      lVar5 = 1;
      if (pcVar2 < pcVar4) {
        *pcVar2 = cVar1;
        lVar5 = 1;
      }
      break;
    case '\f':
      if (pcVar2 < pcVar4) {
        *pcVar2 = '\\';
      }
      lVar5 = 2;
      if (pcVar2 + 1 < pcVar4) {
        pcVar2[1] = 'f';
        goto LAB_001061be;
      }
      break;
    case '\r':
      if (pcVar2 < pcVar4) {
        *pcVar2 = '\\';
      }
      lVar5 = 2;
      if (pcVar2 + 1 < pcVar4) {
        pcVar2[1] = 'r';
        goto LAB_001061be;
      }
      break;
    default:
      if (cVar1 == '\\') {
        if (pcVar2 < pcVar4) {
          *pcVar2 = '\\';
        }
        lVar5 = 2;
        if (pcVar2 + 1 < pcVar4) {
          pcVar2[1] = '\\';
          goto LAB_001061be;
        }
      }
      else {
        if (cVar1 != '\"') goto switchD_001060dd_caseD_b;
        if (pcVar2 < pcVar4) {
          *pcVar2 = '\\';
        }
        lVar5 = 2;
        if (pcVar2 + 1 < pcVar4) {
          pcVar2[1] = '\"';
          goto LAB_001061be;
        }
      }
    }
    str = str + 1;
    pcVar2 = pcVar2 + lVar5;
  } while( true );
}

Assistant:

int json_emit_quoted_str(char *s, int s_len, const char *str, int len) {
    const char *begin = s, *end = s + s_len, *str_end = str + len;
    char ch;

#define EMIT(x) do { if (s < end) *s = x; s++; } while (0)

    EMIT('"');
    while (str < str_end) {
        ch = *str++;
        switch (ch) {
            case '"':
                EMIT('\\');
                EMIT('"');
                break;
            case '\\':
                EMIT('\\');
                EMIT('\\');
                break;
            case '\b':
                EMIT('\\');
                EMIT('b');
                break;
            case '\f':
                EMIT('\\');
                EMIT('f');
                break;
            case '\n':
                EMIT('\\');
                EMIT('n');
                break;
            case '\r':
                EMIT('\\');
                EMIT('r');
                break;
            case '\t':
                EMIT('\\');
                EMIT('t');
                break;
            default:
                EMIT(ch);
        }
    }
    EMIT('"');
    if (s < end) {
        *s = '\0';
    }

    return s - begin;
}